

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::
NameResolverTest_MultipleFilesMessageEdition2023_Test::TestBody
          (NameResolverTest_MultipleFilesMessageEdition2023_Test *this)

{
  long *plVar1;
  Descriptor *descriptor;
  char *pcVar2;
  string_view filename;
  string_view name;
  string_view contents;
  AssertHelper local_e0;
  AssertionResult gtest_ar;
  undefined1 local_c8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined2 local_80;
  ClassNameResolver resolver;
  
  filename._M_str = "foo.proto";
  filename._M_len = 9;
  contents._M_str =
       "\n      edition = \"2023\";\n\n      option java_multiple_files = true;\n\n      package proto2_unittest;\n\n      message FooMessage {}\n                "
  ;
  contents._M_len = 0x90;
  NameResolverTest::BuildFileAndPopulatePool(&this->super_NameResolverTest,filename,contents);
  name._M_str = "proto2_unittest.FooMessage";
  name._M_len = 0x1a;
  descriptor = DescriptorPool::FindMessageTypeByName(&(this->super_NameResolverTest).pool_,name);
  local_c8._8_8_ = &local_b0;
  local_c8[0] = false;
  local_c8[1] = false;
  local_c8[2] = false;
  local_c8[3] = false;
  local_c8[4] = true;
  local_c8[5] = false;
  local_c8._16_8_ = 0;
  local_b0._M_local_buf[0] = '\0';
  local_a0._M_p = (pointer)&local_90;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80._0_1_ = false;
  local_80._1_1_ = true;
  ClassNameResolver::ClassNameResolver(&resolver,(Options *)local_c8);
  Options::~Options((Options *)local_c8);
  ClassNameResolver::GetClassName_abi_cxx11_((string *)local_c8,&resolver,descriptor,true);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[27]>
            ((internal *)&gtest_ar,"resolver.GetClassName(message_descriptor, true)",
             "\"\" \"proto2_unittest.FooMessage\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
             (char (*) [27])"proto2_unittest.FooMessage");
  std::__cxx11::string::~string((string *)local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xf2,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    plVar1 = (long *)CONCAT26(local_c8._6_2_,CONCAT24(local_c8._4_2_,local_c8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::GetJavaImmutableClassName_abi_cxx11_((string *)local_c8,&resolver,descriptor);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[27]>
            ((internal *)&gtest_ar,"resolver.GetJavaImmutableClassName(message_descriptor)",
             "\"\" \"proto2_unittest.FooMessage\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
             (char (*) [27])"proto2_unittest.FooMessage");
  std::__cxx11::string::~string((string *)local_c8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_c8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar2 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar2 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/java/name_resolver_test.cc"
               ,0xf4,pcVar2);
    testing::internal::AssertHelper::operator=(&local_e0,(Message *)local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_e0);
    plVar1 = (long *)CONCAT26(local_c8._6_2_,CONCAT24(local_c8._4_2_,local_c8._0_4_));
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  ClassNameResolver::~ClassNameResolver(&resolver);
  return;
}

Assistant:

TEST_F(NameResolverTest, MultipleFilesMessageEdition2023) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2023";

      option java_multiple_files = true;

      package proto2_unittest;

      message FooMessage {}
                )schema");

  auto message_descriptor =
      pool_.FindMessageTypeByName("proto2_unittest.FooMessage");
  ClassNameResolver resolver;

  EXPECT_EQ(resolver.GetClassName(message_descriptor, /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.FooMessage");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(message_descriptor),
            PACKAGE_PREFIX "proto2_unittest.FooMessage");
}